

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O2

CborError get_string_chunk_size(CborValue *it,size_t *offset,size_t *len)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  CborError CVar7;
  QCborStreamReaderPrivate *self;
  size_t sVar8;
  byte bVar9;
  size_t sVar10;
  qint64 avail;
  
  CVar7 = CborErrorNoMoreStringChunks;
  if ((it->flags & 0x14) != 0) {
    puVar3 = (it->source).ptr;
    lVar4 = *(long *)(puVar3 + 0x68);
    if (*(long *)(puVar3 + 0x18) == lVar4) {
      return CborErrorUnexpectedEOF;
    }
    lVar5 = *(long *)(puVar3 + 0x10);
    bVar9 = *(byte *)(lVar5 + lVar4);
    if ((bVar9 != 0xff) && (CVar7 = CborErrorIllegalType, (bVar9 & 0xe0) == it->type)) {
      sVar10 = (size_t)(bVar9 & 0x1f);
      bVar9 = (byte)(bVar9 & 0x1f);
      if (bVar9 < 0x18) {
        sVar8 = 1;
      }
      else {
        if (0x1b < bVar9) {
          return CborErrorIllegalNumber;
        }
        sVar8 = (size_t)((1 << (bVar9 - 0x18 & 0x1f)) + 1);
        if ((ulong)(*(long *)(puVar3 + 0x18) - lVar4) < sVar8) {
          return CborErrorUnexpectedEOF;
        }
        if (bVar9 < 0x1a) {
          if (bVar9 == 0x19) {
            uVar1 = *(ushort *)(lVar5 + 1 + lVar4);
            sVar10 = (size_t)(ushort)(uVar1 << 8 | uVar1 >> 8);
          }
          else {
            sVar10 = (size_t)*(byte *)(lVar5 + 1 + lVar4);
          }
        }
        else if (bVar9 == 0x1a) {
          uVar2 = *(uint *)(lVar5 + 1 + lVar4);
          sVar10 = (size_t)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
        }
        else {
          uVar6 = *(ulong *)(lVar5 + 1 + lVar4);
          sVar10 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                   | uVar6 << 0x38;
        }
      }
      *len = sVar10;
      *offset = sVar8;
      return CborNoError;
    }
  }
  return CVar7;
}

Assistant:

static CborError get_string_chunk_size(const CborValue *it, size_t *offset, size_t *len)
{
    uint8_t descriptor;
    size_t bytesNeeded = 1;

    if (cbor_value_is_length_known(it) && (it->flags & CborIteratorFlag_BeforeFirstStringChunk) == 0)
        return CborErrorNoMoreStringChunks;

    /* are we at the end? */
    if (!read_bytes(it, &descriptor, 0, 1))
        return CborErrorUnexpectedEOF;

    if (descriptor == BreakByte)
        return CborErrorNoMoreStringChunks;
    if ((descriptor & MajorTypeMask) != it->type)
        return CborErrorIllegalType;

    /* find the string length */
    descriptor &= SmallValueMask;
    if (descriptor < Value8Bit) {
        *len = descriptor;
    } else if (unlikely(descriptor > Value64Bit)) {
        return CborErrorIllegalNumber;
    } else {
        uint64_t val;
        bytesNeeded = (size_t)(1 << (descriptor - Value8Bit));
        if (!can_read_bytes(it, 1 + bytesNeeded))
            return CborErrorUnexpectedEOF;

        if (descriptor <= Value16Bit) {
            if (descriptor == Value16Bit)
                val = read_uint16(it, 1);
            else
                val = read_uint8(it, 1);
        } else {
            if (descriptor == Value32Bit)
                val = read_uint32(it, 1);
            else
                val = read_uint64(it, 1);
        }

        *len = val;
        if (*len != val)
            return CborErrorDataTooLarge;

        ++bytesNeeded;
    }

    *offset = bytesNeeded;
    return CborNoError;
}